

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

MicroString * __thiscall
google::protobuf::Reflection::GetRawSplit<google::protobuf::internal::MicroString>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t offset;
  LogMessage *pLVar2;
  void *message_00;
  MicroString **ppMVar3;
  string_view v;
  uint32_t field_offset;
  void *split;
  LogMessage local_40;
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  VerifyFieldType<google::protobuf::internal::MicroString>(this,field);
  bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,local_28);
  if (!bVar1) {
    message_00 = GetSplitField(this,(Message *)field_local);
    offset = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,local_28);
    bVar1 = internal::SplitFieldHasExtraIndirectionStatic<google::protobuf::internal::MicroString>
                      (local_28);
    if (bVar1) {
      ppMVar3 = internal::GetConstPointerAtOffset<google::protobuf::internal::MicroString*>
                          (message_00,offset);
      this_local = (Reflection *)*ppMVar3;
    }
    else {
      this_local = (Reflection *)
                   internal::GetConstPointerAtOffset<google::protobuf::internal::MicroString>
                             (message_00,offset);
    }
    return (MicroString *)this_local;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
             ,0x6eb,"!schema_.InRealOneof(field)");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [9])"Field = ")
  ;
  v = FieldDescriptor::full_name(local_28);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

const Type& Reflection::GetRawSplit(const Message& message,
                                    const FieldDescriptor* field) const {
  VerifyFieldType<Type>(field);
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const void* split = GetSplitField(&message);
  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  if (internal::SplitFieldHasExtraIndirectionStatic<Type>(field)) {
    return **internal::GetConstPointerAtOffset<Type*>(split, field_offset);
  }
  return *internal::GetConstPointerAtOffset<Type>(split, field_offset);
}